

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O1

void sendsuboption(connectdata *conn,int option)

{
  long *plVar1;
  long *buffer;
  void *__buf;
  undefined2 uVar2;
  Curl_easy *data;
  void *pvVar3;
  long *plVar4;
  long lVar5;
  ssize_t sVar6;
  uint *puVar7;
  
  if (option == 0x1f) {
    data = conn->data;
    pvVar3 = (data->req).protop;
    plVar1 = (long *)((long)pvVar3 + 0x1eb8);
    *(undefined2 *)((long)pvVar3 + 0x1cb8) = 0xfaff;
    buffer = (long *)((long)pvVar3 + 0x1cbb);
    *(long **)((long)pvVar3 + 0x1eb8) = buffer;
    *(undefined1 *)((long)pvVar3 + 0x1cba) = 0x1f;
    uVar2 = *(undefined2 *)((long)pvVar3 + 0x1caa);
    if (buffer < plVar1) {
      *plVar1 = (long)pvVar3 + 0x1cbc;
      *(char *)buffer = (char)((ushort)*(undefined2 *)((long)pvVar3 + 0x1ca8) >> 8);
    }
    plVar4 = (long *)*plVar1;
    if (plVar4 < plVar1) {
      *plVar1 = (long)((long)plVar4 + 1);
      *(char *)plVar4 = (char)*(undefined2 *)((long)pvVar3 + 0x1ca8);
    }
    plVar4 = (long *)*plVar1;
    if (plVar4 < plVar1) {
      *plVar1 = (long)plVar4 + 1;
      *(char *)plVar4 = (char)((ushort)uVar2 >> 8);
    }
    plVar4 = (long *)*plVar1;
    if (plVar4 < plVar1) {
      *plVar1 = (long)plVar4 + 1;
      *(char *)plVar4 = (char)uVar2;
    }
    plVar4 = (long *)*plVar1;
    if (plVar4 < plVar1) {
      *plVar1 = (long)plVar4 + 1;
      *(undefined1 *)plVar4 = 0xff;
    }
    __buf = (void *)((long)pvVar3 + 0x1cb8);
    plVar4 = (long *)*plVar1;
    if (plVar4 < plVar1) {
      *plVar1 = (long)plVar4 + 1;
      *(undefined1 *)plVar4 = 0xf0;
    }
    lVar5 = *(long *)((long)pvVar3 + 0x1eb8);
    *(long *)((long)pvVar3 + 0x1ec0) = lVar5;
    *(void **)((long)pvVar3 + 0x1eb8) = __buf;
    printsub(data,0x3e,(uchar *)((long)pvVar3 + 0x1cba),(lVar5 - (long)__buf) - 2);
    sVar6 = send(conn->sock[0],__buf,3,0x4000);
    if (sVar6 < 0) {
      puVar7 = (uint *)__errno_location();
      Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar7);
    }
    send_telnet_data(conn,(char *)buffer,4);
    sVar6 = send(conn->sock[0],(void *)((long)pvVar3 + 0x1cbf),2,0x4000);
    if (sVar6 < 0) {
      puVar7 = (uint *)__errno_location();
      Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar7);
      return;
    }
  }
  return;
}

Assistant:

static void sendsuboption(struct connectdata *conn, int option)
{
  ssize_t bytes_written;
  int err;
  unsigned short x, y;
  unsigned char *uc1, *uc2;

  struct Curl_easy *data = conn->data;
  struct TELNET *tn = (struct TELNET *)data->req.protop;

  switch(option) {
  case CURL_TELOPT_NAWS:
    /* We prepare data to be sent */
    CURL_SB_CLEAR(tn);
    CURL_SB_ACCUM(tn, CURL_IAC);
    CURL_SB_ACCUM(tn, CURL_SB);
    CURL_SB_ACCUM(tn, CURL_TELOPT_NAWS);
    /* We must deal either with little or big endian processors */
    /* Window size must be sent according to the 'network order' */
    x = htons(tn->subopt_wsx);
    y = htons(tn->subopt_wsy);
    uc1 = (unsigned char *)&x;
    uc2 = (unsigned char *)&y;
    CURL_SB_ACCUM(tn, uc1[0]);
    CURL_SB_ACCUM(tn, uc1[1]);
    CURL_SB_ACCUM(tn, uc2[0]);
    CURL_SB_ACCUM(tn, uc2[1]);

    CURL_SB_ACCUM(tn, CURL_IAC);
    CURL_SB_ACCUM(tn, CURL_SE);
    CURL_SB_TERM(tn);
    /* data suboption is now ready */

    printsub(data, '>', (unsigned char *)tn->subbuffer + 2,
             CURL_SB_LEN(tn)-2);

    /* we send the header of the suboption... */
    bytes_written = swrite(conn->sock[FIRSTSOCKET], tn->subbuffer, 3);
    if(bytes_written < 0) {
      err = SOCKERRNO;
      failf(data, "Sending data failed (%d)", err);
    }
    /* ... then the window size with the send_telnet_data() function
       to deal with 0xFF cases ... */
    send_telnet_data(conn, (char *)tn->subbuffer + 3, 4);
    /* ... and the footer */
    bytes_written = swrite(conn->sock[FIRSTSOCKET], tn->subbuffer + 7, 2);
    if(bytes_written < 0) {
      err = SOCKERRNO;
      failf(data, "Sending data failed (%d)", err);
    }
    break;
  }
}